

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::checkPerModifications(string *unit_string,uint64_t match_flags)

{
  bool bVar1;
  size_t sVar2;
  precise_unit pVar3;
  string local_88;
  allocator local_51;
  string local_50;
  size_t local_30;
  size_t fnd;
  uint64_t match_flags_local;
  string *unit_string_local;
  precise_unit retunit;
  
  if ((match_flags & 0x200000) == 0) {
    fnd = match_flags;
    match_flags_local = (uint64_t)unit_string;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"per",&local_51);
    sVar2 = findWordOperatorSep(unit_string,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if (sVar2 != 0xffffffffffffffff) {
      local_30 = sVar2;
      if (sVar2 == 0) {
        std::__cxx11::string::replace((ulong)unit_string,0,(char *)0x3);
      }
      else {
        std::__cxx11::string::replace((ulong)unit_string,sVar2,(char *)0x3);
      }
      std::__cxx11::string::string((string *)&local_88,(string *)unit_string);
      pVar3 = unit_from_string_internal(&local_88,fnd + 0x80000);
      retunit.multiplier_ = pVar3._8_8_;
      unit_string_local = (string *)pVar3.multiplier_;
      std::__cxx11::string::~string((string *)&local_88);
      bVar1 = is_error((precise_unit *)&unit_string_local);
      if (!bVar1) goto LAB_001aab5a;
    }
  }
  unit_string_local = (string *)0x7ff4000000000000;
  retunit.multiplier_ = 2.07707442941207e-314;
LAB_001aab5a:
  pVar3._8_8_ = retunit.multiplier_;
  pVar3.multiplier_ = (double)unit_string_local;
  return pVar3;
}

Assistant:

static precise_unit
    checkPerModifications(std::string unit_string, std::uint64_t match_flags)
{
    // try changing out any "per" words for division sign
    if ((match_flags & no_per_operators) == 0) {
        auto fnd = findWordOperatorSep(unit_string, "per");
        if (fnd != std::string::npos) {
            if (fnd == 0) {
                unit_string.replace(fnd, 3, "1/");
            } else {
                unit_string.replace(fnd, 3, "/");
            }
            auto retunit = unit_from_string_internal(
                unit_string, match_flags + per_operator1);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}